

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Rectify::backward_impl
          (Rectify *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  FRectifyBackward *in_stack_ffffffffffffff58;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff60;
  Tensor *in_stack_ffffffffffffff68;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff70;
  
  Tensor::vec(in_stack_ffffffffffffff68);
  Tensor::vec(in_stack_ffffffffffffff68);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
  binaryExpr<cnn::FRectifyBackward,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  Tensor::vec(in_stack_ffffffffffffff68);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator+=
            (in_stack_ffffffffffffff70,
             (MatrixBase<Eigen::CwiseBinaryOp<cnn::FRectifyBackward,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)in_stack_ffffffffffffff68);
  return;
}

Assistant:

void Rectify::backward_impl(const vector<const Tensor*>& xs,
                         const Tensor& fx,
                         const Tensor& dEdf,
                         unsigned i,
                         Tensor& dEdxi) const {
#if HAVE_CUDA
  gpu::vrelu_backward(fx.d.size(), fx.v, dEdf.v, dEdxi.v);
#else
  dEdxi.vec() += fx.vec().binaryExpr(dEdf.vec(), FRectifyBackward());
#endif
}